

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

RPCHelpMan * getmininginfo(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCMethodImpl fun;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  bool bVar3;
  long lVar4;
  RPCHelpMan *in_RDI;
  string *this;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_fffffffffffff478;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff47c;
  undefined8 in_stack_fffffffffffff480;
  undefined8 in_stack_fffffffffffff488;
  undefined8 in_stack_fffffffffffff490;
  _Manager_type in_stack_fffffffffffff498;
  undefined8 in_stack_fffffffffffff4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff4a8;
  pointer in_stack_fffffffffffff4b8;
  pointer in_stack_fffffffffffff4c0;
  pointer in_stack_fffffffffffff4c8;
  _Vector_impl_data in_stack_fffffffffffff4d0;
  undefined1 in_stack_fffffffffffff4e8 [16];
  pointer in_stack_fffffffffffff4f8;
  pointer in_stack_fffffffffffff500;
  pointer in_stack_fffffffffffff508;
  undefined8 in_stack_fffffffffffff510;
  pointer pRVar6;
  pointer pRVar7;
  allocator<char> local_aca;
  allocator<char> local_ac9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ac8;
  allocator<char> local_aaa;
  allocator<char> local_aa9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_aa8;
  allocator<char> local_a8a;
  allocator<char> local_a89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a88;
  allocator<char> local_a6a;
  allocator<char> local_a69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a68;
  allocator<char> local_a4a;
  allocator<char> local_a49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a48;
  allocator<char> local_a2a;
  allocator<char> local_a29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a28;
  allocator<char> local_a02;
  allocator<char> local_a01;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a00;
  allocator<char> local_9e2;
  allocator<char> local_9e1;
  RPCResults local_9e0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_9c8;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  char *local_8c0;
  size_type local_8b8;
  char local_8b0 [8];
  undefined8 uStack_8a8;
  string local_8a0 [32];
  string local_880 [32];
  RPCResult local_860;
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758;
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  RPCResult local_578 [4];
  RPCResult local_358;
  RPCResult local_2d0;
  RPCResult local_248;
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getmininginfo",&local_9a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"\nReturns a json object containing mining-related information.",&local_9a2);
  local_9c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_9c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_9c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_9e1);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_9e2);
  std::__cxx11::string::string<std::allocator<char>>(local_598,"blocks",&local_a01);
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"The current block",&local_a02);
  local_a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff478;
  m_key_name._M_string_length = in_stack_fffffffffffff480;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff490;
  description._M_string_length = in_stack_fffffffffffff4a0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description.field_2 = in_stack_fffffffffffff4a8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff4c0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff4b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(local_578,NUM,m_key_name,description,inner,SUB81(local_598,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"currentblockweight",&local_a29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,
             "The block weight of the last assembled block (only present if a block was ever assembled)"
             ,&local_a2a);
  local_a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_fffffffffffff480;
  auVar1._0_4_ = in_stack_fffffffffffff47c;
  auVar1._12_8_ = in_stack_fffffffffffff488;
  auVar1._20_8_ = in_stack_fffffffffffff490;
  auVar1._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff4a0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_00.field_2 = in_stack_fffffffffffff4a8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult
            (local_578 + 1,NUM,(string)(auVar1 << 0x20),SUB81(local_5d8,0),description_00,inner_00,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_618,"currentblocktx",&local_a49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_638,
             "The number of block transactions of the last assembled block (only present if a block was ever assembled)"
             ,&local_a4a);
  local_a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = 0;
  auVar2._4_8_ = in_stack_fffffffffffff480;
  auVar2._0_4_ = in_stack_fffffffffffff47c;
  auVar2._12_8_ = in_stack_fffffffffffff488;
  auVar2._20_8_ = in_stack_fffffffffffff490;
  auVar2._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff4a0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_01.field_2 = in_stack_fffffffffffff4a8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult
            (local_578 + 2,NUM,(string)(auVar2 << 0x20),SUB81(local_618,0),description_01,inner_01,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_658,"difficulty",&local_a69);
  std::__cxx11::string::string<std::allocator<char>>(local_678,"The current difficulty",&local_a6a);
  local_a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar5;
  m_key_name_00._M_string_length = in_stack_fffffffffffff480;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff490;
  description_02._M_string_length = in_stack_fffffffffffff4a0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_02.field_2 = in_stack_fffffffffffff4a8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(local_578 + 3,NUM,m_key_name_00,description_02,inner_02,SUB81(local_658,0));
  std::__cxx11::string::string<std::allocator<char>>(local_698,"networkhashps",&local_a89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b8,"The network hashes per second",&local_a8a);
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar5;
  m_key_name_01._M_string_length = in_stack_fffffffffffff480;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff490;
  description_03._M_string_length = in_stack_fffffffffffff4a0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_03.field_2 = in_stack_fffffffffffff4a8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_358,NUM,m_key_name_01,description_03,inner_03,SUB81(local_698,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"pooledtx",&local_aa9);
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"The size of the mempool",&local_aaa)
  ;
  local_ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar5;
  m_key_name_02._M_string_length = in_stack_fffffffffffff480;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff490;
  description_04._M_string_length = in_stack_fffffffffffff4a0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_04.field_2 = in_stack_fffffffffffff4a8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_2d0,NUM,m_key_name_02,description_04,inner_04,SUB81(local_6d8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_718,"chain",&local_ac9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_738,"current network name (main, test, testnet4, signet, regtest)",&local_aca);
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar5;
  m_key_name_03._M_string_length = in_stack_fffffffffffff480;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff490;
  description_05._M_string_length = in_stack_fffffffffffff4a0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_05.field_2 = in_stack_fffffffffffff4a8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_248,STR,m_key_name_03,description_05,inner_05,SUB81(local_718,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"warnings",(allocator<char> *)&stack0xfffffffffffff517);
  bVar3 = IsDeprecatedRPCEnabled(&local_758);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_778,"warnings",(allocator<char> *)&local_860);
    std::__cxx11::string::string<std::allocator<char>>
              (local_798,"any network and blockchain warnings (DEPRECATED)",
               (allocator<char> *)&stack0xfffffffffffff516);
    in_stack_fffffffffffff4f8 = (pointer)0x0;
    in_stack_fffffffffffff500 = (pointer)0x0;
    in_stack_fffffffffffff508 = (pointer)0x0;
    m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
    m_key_name_04._M_dataplus._M_p._0_4_ = uVar5;
    m_key_name_04._M_string_length = in_stack_fffffffffffff480;
    m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
    m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff490;
    description_06._M_string_length = in_stack_fffffffffffff4a0;
    description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
    description_06.field_2 = in_stack_fffffffffffff4a8;
    inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_fffffffffffff4c0;
    inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffff4b8;
    inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
    RPCResult::RPCResult(&local_1c0,STR,m_key_name_04,description_06,inner_06,SUB81(local_778,0));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_7b8,"warnings",(allocator<char> *)&stack0xfffffffffffff516);
    std::__cxx11::string::string<std::allocator<char>>
              (local_7d8,
               "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)"
               ,(allocator<char> *)&stack0xfffffffffffff4f7);
    std::__cxx11::string::string<std::allocator<char>>
              (local_880,"",(allocator<char> *)&stack0xfffffffffffff4d7);
    std::__cxx11::string::string<std::allocator<char>>
              (local_8a0,"warning",(allocator<char> *)&stack0xfffffffffffff4d6);
    in_stack_fffffffffffff4b8 = (pointer)0x0;
    in_stack_fffffffffffff4c0 = (pointer)0x0;
    in_stack_fffffffffffff4c8 = (pointer)0x0;
    m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
    m_key_name_05._M_dataplus._M_p._0_4_ = uVar5;
    m_key_name_05._M_string_length = in_stack_fffffffffffff480;
    m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
    m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff490;
    description_07._M_string_length = in_stack_fffffffffffff4a0;
    description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
    description_07.field_2 = in_stack_fffffffffffff4a8;
    inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    RPCResult::RPCResult(&local_860,STR,m_key_name_05,description_07,inner_07,SUB81(local_880,0));
    __l._M_len = 1;
    __l._M_array = &local_860;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4d8,__l,
               (allocator_type *)&stack0xfffffffffffff4b7);
    m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
    m_key_name_06._M_dataplus._M_p._0_4_ = uVar5;
    m_key_name_06._M_string_length = in_stack_fffffffffffff480;
    m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
    m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff490;
    description_08._M_string_length = in_stack_fffffffffffff4a0;
    description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
    description_08.field_2._M_local_buf = in_stack_fffffffffffff4a8._M_local_buf;
    inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_fffffffffffff4c0;
    inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffff4b8;
    inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
    RPCResult::RPCResult(&local_1c0,ARR,m_key_name_06,description_08,inner_08,SUB81(local_7b8,0));
  }
  __l_00._M_len = 8;
  __l_00._M_array = local_578;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a00,__l_00,(allocator_type *)&stack0xfffffffffffff4b6);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar5;
  m_key_name_07._M_string_length = in_stack_fffffffffffff480;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff490;
  description_09._M_string_length = in_stack_fffffffffffff4a0;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_09.field_2 = in_stack_fffffffffffff4a8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_f8,OBJ,m_key_name_07,description_09,inner_09,SUB81(local_118,0));
  result._4_4_ = in_stack_fffffffffffff47c;
  result.m_type = uVar5;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff480;
  result.m_key_name._M_string_length = in_stack_fffffffffffff488;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff490;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff498;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4a0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff4a8;
  result._64_8_ = in_stack_fffffffffffff4b8;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4c0;
  result.m_description._M_string_length = (size_type)in_stack_fffffffffffff4c8;
  result._88_24_ = in_stack_fffffffffffff4d0;
  result.m_cond._8_16_ = in_stack_fffffffffffff4e8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff4f8;
  RPCResults::RPCResults(&local_9e0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_920,"getmininginfo",(allocator<char> *)&stack0xfffffffffffff4b5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"",(allocator<char> *)&stack0xfffffffffffff4b4);
  HelpExampleCli(&local_900,&local_920,&local_940);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"getmininginfo",(allocator<char> *)&stack0xfffffffffffff4b3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"",(allocator<char> *)&stack0xfffffffffffff4b2);
  HelpExampleRpc(&local_960,&local_980,&local_9a0);
  std::operator+(&local_8e0,&local_900,&local_960);
  local_8c0 = local_8b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p == &local_8e0.field_2) {
    uStack_8a8 = local_8e0.field_2._8_8_;
  }
  else {
    local_8c0 = local_8e0._M_dataplus._M_p;
  }
  local_8b8 = local_8e0._M_string_length;
  local_8e0._M_string_length = 0;
  local_8e0.field_2._M_local_buf[0] = '\0';
  description_10._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:441:9)>
       ::_M_invoke;
  description_10._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:441:9)>
                ::_M_manager;
  description_10.field_2 = in_stack_fffffffffffff4a8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff4c0;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_fffffffffffff4b8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff4c8;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff4f8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4e8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff4e8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff500;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff510;
  fun.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffff508;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar6;
  fun._M_invoker = (_Invoker_type)pRVar7;
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff480,&stack0xfffffffffffff488)),
             description_10,args,(RPCResults)in_stack_fffffffffffff4d0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff488);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_920);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_9e0.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a00);
  lVar4 = 0x3b8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_578[0].m_type + lVar4));
    lVar4 = lVar4 + -0x88;
  } while (lVar4 != -0x88);
  if (bVar3) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f8);
    std::__cxx11::string::~string(local_798);
    this = local_778;
  }
  else {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4d8);
    RPCResult::~RPCResult(&local_860);
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4b8);
    std::__cxx11::string::~string(local_8a0);
    std::__cxx11::string::~string(local_880);
    std::__cxx11::string::~string(local_7d8);
    this = local_7b8;
  }
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string((string *)&local_758);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff518);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_718);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ac8);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_6d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_aa8);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_698);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a88);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_658);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a68);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_618);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a48);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_5d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a28);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_9c8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmininginfo()
{
    return RPCHelpMan{"getmininginfo",
                "\nReturns a json object containing mining-related information.",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM, "blocks", "The current block"},
                        {RPCResult::Type::NUM, "currentblockweight", /*optional=*/true, "The block weight of the last assembled block (only present if a block was ever assembled)"},
                        {RPCResult::Type::NUM, "currentblocktx", /*optional=*/true, "The number of block transactions of the last assembled block (only present if a block was ever assembled)"},
                        {RPCResult::Type::NUM, "difficulty", "The current difficulty"},
                        {RPCResult::Type::NUM, "networkhashps", "The network hashes per second"},
                        {RPCResult::Type::NUM, "pooledtx", "The size of the mempool"},
                        {RPCResult::Type::STR, "chain", "current network name (" LIST_CHAIN_NAMES ")"},
                        (IsDeprecatedRPCEnabled("warnings") ?
                            RPCResult{RPCResult::Type::STR, "warnings", "any network and blockchain warnings (DEPRECATED)"} :
                            RPCResult{RPCResult::Type::ARR, "warnings", "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)",
                            {
                                {RPCResult::Type::STR, "", "warning"},
                            }
                            }
                        ),
                    }},
                RPCExamples{
                    HelpExampleCli("getmininginfo", "")
            + HelpExampleRpc("getmininginfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CTxMemPool& mempool = EnsureMemPool(node);
    ChainstateManager& chainman = EnsureChainman(node);
    LOCK(cs_main);
    const CChain& active_chain = chainman.ActiveChain();

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("blocks",           active_chain.Height());
    if (BlockAssembler::m_last_block_weight) obj.pushKV("currentblockweight", *BlockAssembler::m_last_block_weight);
    if (BlockAssembler::m_last_block_num_txs) obj.pushKV("currentblocktx", *BlockAssembler::m_last_block_num_txs);
    obj.pushKV("difficulty", GetDifficulty(*CHECK_NONFATAL(active_chain.Tip())));
    obj.pushKV("networkhashps",    getnetworkhashps().HandleRequest(request));
    obj.pushKV("pooledtx",         (uint64_t)mempool.size());
    obj.pushKV("chain", chainman.GetParams().GetChainTypeString());
    obj.pushKV("warnings", node::GetWarningsForRpc(*CHECK_NONFATAL(node.warnings), IsDeprecatedRPCEnabled("warnings")));
    return obj;
},
    };
}